

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svlogd.c
# Opt level: O3

int buffer_pwrite(int n,char *s,uint len)

{
  unsigned_long uVar1;
  logdir *plVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ssize_t sVar6;
  int *piVar7;
  DIR *__dirp;
  dirent *pdVar8;
  ulong uVar9;
  uint uVar10;
  char *s_00;
  ulong uVar11;
  char oldest [30];
  undefined2 local_58 [13];
  undefined1 local_3d;
  
  uVar11 = dir[n].sizemax;
  uVar10 = len;
  if (uVar11 != 0) {
    uVar9 = dir[n].size;
    if (uVar11 <= uVar9) {
      rotate(dir + n);
      uVar9 = dir[n].size;
      uVar11 = dir[n].sizemax;
    }
    uVar10 = (uint)(uVar11 - uVar9);
    if ((ulong)len <= uVar11 - uVar9) {
      uVar10 = len;
    }
  }
  sVar6 = write(dir[n].fdcur,s,(ulong)uVar10);
  if ((int)sVar6 == -1) {
    piVar7 = __errno_location();
    do {
      iVar3 = *piVar7;
      if (iVar3 == 0x1c) {
        if (dir[n].nmin < dir[n].nmax) {
          iVar3 = fchdir(dir[n].fddir);
          while (iVar3 == -1) {
            strerr_warn("svlogd: pausing: ","unable to change directory, want remove old logfile",
                        ": ",dir[n].name,": ",(char *)0x0,&strerr_sys);
            sleep(3);
            iVar3 = fchdir(dir[n].fddir);
          }
          local_58[0] = 0x41;
          local_3d = 0;
          __dirp = opendir(".");
          while (__dirp == (DIR *)0x0) {
            strerr_warn("svlogd: pausing: ","unable to open directory, want remove old logfile",": "
                        ,dir[n].name,": ",(char *)0x0,&strerr_sys);
            sleep(3);
            __dirp = opendir(".");
          }
          *piVar7 = 0;
          pdVar8 = readdir(__dirp);
          if (pdVar8 == (dirent *)0x0) {
            uVar11 = 0;
          }
          else {
            iVar3 = 0;
            do {
              if (pdVar8->d_name[0] == '@') {
                s_00 = pdVar8->d_name;
                uVar4 = str_len(s_00);
                if (uVar4 == 0x1b) {
                  iVar3 = iVar3 + 1;
                  iVar5 = str_diff(s_00,(char *)local_58);
                  if (iVar5 < 0) {
                    byte_copy((char *)local_58,0x1b,s_00);
                  }
                }
              }
              pdVar8 = readdir(__dirp);
            } while (pdVar8 != (dirent *)0x0);
            uVar11 = (ulong)iVar3;
          }
          if (*piVar7 != 0) {
            strerr_warn("svlogd: warning: ","unable to read directory, want remove old logfile",": "
                        ,dir[n].name,": ",(char *)0x0,&strerr_sys);
          }
          closedir(__dirp);
          *piVar7 = 0x1c;
          if ((dir[n].nmin < uVar11) && ((char)local_58[0] == '@')) {
            strerr_warn("svlogd: warning: ","out of disk space, delete: ",dir[n].name,"/",
                        (char *)local_58,(char *)0x0,(strerr *)0x0);
            *piVar7 = 0;
            iVar3 = unlink((char *)local_58);
            if (iVar3 == -1) {
              strerr_warn("svlogd: warning: ","unable to unlink oldest logfile",": ",dir[n].name,
                          ": ",(char *)0x0,&strerr_sys);
              *piVar7 = 0x1c;
            }
            iVar3 = fchdir(fdwdir);
            while (iVar3 == -1) {
              strerr_warn("svlogd: pausing: ","unable to change to initial working directory",": ",
                          (char *)0x0,(char *)0x0,(char *)0x0,&strerr_sys);
              sleep(3);
              iVar3 = fchdir(fdwdir);
            }
          }
          iVar3 = *piVar7;
          goto LAB_001048b5;
        }
LAB_001048b9:
        strerr_warn("svlogd: pausing: ","unable to write to current",": ",dir[n].name,": ",
                    (char *)0x0,&strerr_sys);
        sleep(3);
      }
      else {
LAB_001048b5:
        if (iVar3 != 0) goto LAB_001048b9;
      }
      sVar6 = write(dir[n].fdcur,s,(ulong)uVar10);
    } while ((int)sVar6 == -1);
  }
  plVar2 = dir;
  uVar11 = (long)(int)sVar6 + dir[n].size;
  dir[n].size = uVar11;
  uVar1 = plVar2[n].sizemax;
  if (((uVar1 != 0) && (s[(sVar6 << 0x20) + -0x100000000 >> 0x20] == '\n')) &&
     (uVar1 - linemax <= uVar11)) {
    rotate(plVar2 + n);
  }
  return (int)sVar6;
}

Assistant:

int buffer_pwrite(int n, char *s, unsigned int len) {
  int i;

  if ((dir +n)->sizemax) {
    if ((dir +n)->size >= (dir +n)->sizemax) rotate(dir +n);
    if (len > ((dir +n)->sizemax -(dir +n)->size))
      len =(dir +n)->sizemax -(dir +n)->size;
  }
  while ((i =write((dir +n)->fdcur, s, len)) == -1) {
    if ((errno == ENOSPC) && ((dir +n)->nmin < (dir +n)->nmax)) {
      DIR *d;
      direntry *f;
      char oldest[FMT_PTIME];
      int j =0;

      while (fchdir((dir +n)->fddir) == -1)
        pause2("unable to change directory, want remove old logfile",
               (dir +n)->name);
      oldest[0] ='A'; oldest[1] =oldest[27] =0;
      while (! (d =opendir(".")))
        pause2("unable to open directory, want remove old logfile",
               (dir +n)->name);
      errno =0;
      while ((f =readdir(d)))
        if ((f->d_name[0] == '@') && (str_len(f->d_name) == 27)) {
          ++j;
          if (str_diff(f->d_name, oldest) < 0)
            byte_copy(oldest, 27, f->d_name);
        }
      if (errno) warn2("unable to read directory, want remove old logfile",
                       (dir +n)->name);
      closedir(d);
      errno =ENOSPC;
      if (j > (dir +n)->nmin)
        if (*oldest == '@') {
          strerr_warn5(WARNING, "out of disk space, delete: ", (dir +n)->name,
                       "/", oldest, 0);
          errno =0;
          if (unlink(oldest) == -1) {
            warn2("unable to unlink oldest logfile", (dir +n)->name);
            errno =ENOSPC;
          }
          while (fchdir(fdwdir) == -1)
            pause1("unable to change to initial working directory");
        }
    }
    if (errno) pause2("unable to write to current", (dir +n)->name);
  }

  (dir +n)->size +=i;
  if ((dir +n)->sizemax)
    if (s[i -1] == '\n')
      if ((dir +n)->size >= ((dir +n)->sizemax -linemax)) rotate(dir +n);
  return(i);
}